

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

int mcpl_tool(int argc,char **argv)

{
  byte bVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  long *__ptr;
  mcpl_file_t mVar12;
  FILE *__stream;
  mcpl_outfile_t mVar13;
  mcpl_particle_t *pmVar14;
  char *__dest;
  char cVar15;
  ulong uVar16;
  uint uVar17;
  long *plVar18;
  char *pcVar19;
  undefined8 in_R9;
  long lVar20;
  mcpl_outfileinternal_t *f_1;
  long lVar21;
  undefined8 uVar22;
  mcpl_fileinternal_t *f;
  long local_4a0;
  int local_48c;
  int local_488;
  int local_484;
  char *local_480;
  char *local_478;
  int64_t opt_num_skip;
  undefined8 local_458;
  int64_t opt_num_limit;
  int local_448;
  uint32_t ldata;
  undefined8 local_440;
  char comment [1024];
  
  opt_num_limit = -1;
  opt_num_skip = -1;
  local_440 = 0;
  lVar21 = 1;
  bVar6 = false;
  local_488 = 0;
  local_48c = 0;
  local_448 = 0;
  bVar7 = false;
  bVar4 = false;
  local_484 = 0;
  bVar5 = false;
  bVar3 = false;
  local_458 = 0;
  iVar10 = 0;
  local_478 = (char *)0x0;
  local_480 = (char *)0x0;
  __ptr = (long *)0x0;
  uVar17 = 0;
LAB_00105bb8:
  if (argc <= lVar21) goto LAB_00105f51;
  pcVar19 = argv[lVar21];
  sVar11 = strlen(pcVar19);
  if (sVar11 != 0) {
    if (sVar11 == 1) {
      cVar15 = *pcVar19;
LAB_00105be1:
      if (cVar15 == '-') {
LAB_00105fca:
        free(__ptr);
        pcVar19 = "Bad arguments";
        goto LAB_001064ba;
      }
    }
    else if (*pcVar19 == '-') {
      if (pcVar19[1] == '-') {
        cVar15 = '-';
        if (sVar11 < 3) goto LAB_00105be1;
        if (pcVar19[1] != '-') goto LAB_00105fca;
        pcVar19 = pcVar19 + 2;
        sVar11 = strlen(pcVar19);
        iVar8 = strncmp("help",pcVar19,sVar11);
        if (iVar8 == 0) {
          free(__ptr);
LAB_001060f7:
          pcVar19 = (char *)0x0;
          goto LAB_001064ba;
        }
        iVar8 = strncmp("justhead",pcVar19,sVar11);
        if (iVar8 == 0) {
          iVar10 = 1;
        }
        else {
          iVar8 = strncmp("nohead",pcVar19,sVar11);
          if (iVar8 == 0) {
            local_458 = 1;
          }
          else {
            iVar8 = strncmp("merge",pcVar19,sVar11);
            if (iVar8 == 0) {
              bVar3 = true;
            }
            else {
              iVar8 = strncmp("forcemerge",pcVar19,sVar11);
              if (iVar8 == 0) {
                bVar5 = true;
              }
              else {
                iVar8 = strncmp("keepuserflags",pcVar19,sVar11);
                if (iVar8 == 0) {
                  local_484 = 1;
                }
                else {
                  iVar8 = strncmp("inplace",pcVar19,sVar11);
                  if (iVar8 == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar8 = strncmp("extract",pcVar19,sVar11);
                    if (iVar8 == 0) {
                      bVar7 = true;
                    }
                    else {
                      iVar8 = strncmp("repair",pcVar19,sVar11);
                      if (iVar8 == 0) {
                        local_48c = 1;
                      }
                      else {
                        iVar8 = strncmp("version",pcVar19,sVar11);
                        if (iVar8 == 0) {
                          local_488 = 1;
                        }
                        else {
                          iVar8 = strncmp("preventcomment",pcVar19,sVar11);
                          if (iVar8 == 0) {
                            local_448 = 1;
                          }
                          else {
                            iVar8 = strncmp("fakeversion",pcVar19,sVar11);
                            if (iVar8 == 0) {
                              local_440 = 1;
                              goto LAB_00105da8;
                            }
                            iVar8 = strncmp("text",pcVar19,sVar11);
                            if (iVar8 != 0) {
                              free(__ptr);
                              pcVar19 = "Unrecognised option";
                              goto LAB_001064ba;
                            }
                            bVar6 = true;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        pcVar19 = pcVar19 + 2;
        plVar18 = (long *)0x0;
        for (uVar16 = 1; uVar16 < sVar11; uVar16 = uVar16 + 1) {
          bVar1 = pcVar19[-1];
          if (plVar18 != (long *)0x0) {
            if (0xf5 < (byte)(bVar1 - 0x3a)) {
              lVar20 = *plVar18;
              *plVar18 = lVar20 * 10;
              *plVar18 = lVar20 * 10 + (long)pcVar19[-1] + -0x30;
              goto LAB_00105df7;
            }
            free(__ptr);
            pcVar19 = "Bad option: expected number";
            goto LAB_001064ba;
          }
          if (0x14 < bVar1 - 0x62) {
switchD_00105e20_caseD_63:
            free(__ptr);
            pcVar19 = "Unrecognised option";
            goto LAB_001064ba;
          }
          plVar18 = &opt_num_limit;
          switch((uint)bVar1) {
          case 0x62:
            if (local_480 != (char *)0x0) {
              free(__ptr);
              pcVar19 = "-b specified more than once";
              goto LAB_001064ba;
            }
            local_480 = pcVar19;
            if (uVar16 - sVar11 == -1) {
              free(__ptr);
              pcVar19 = "Missing argument for -b";
              goto LAB_001064ba;
            }
            goto LAB_00105da8;
          default:
            goto switchD_00105e20_caseD_63;
          case 0x65:
            plVar18 = (long *)0x0;
            bVar7 = true;
            break;
          case 0x68:
            free(__ptr);
            goto LAB_001060f7;
          case 0x6a:
            plVar18 = (long *)0x0;
            iVar10 = 1;
            break;
          case 0x6c:
            goto switchD_00105e20_caseD_6c;
          case 0x6d:
            plVar18 = (long *)0x0;
            bVar3 = true;
            break;
          case 0x6e:
            plVar18 = (long *)0x0;
            local_458 = 1;
            break;
          case 0x70:
            if (local_478 != (char *)0x0) {
              free(__ptr);
              pcVar19 = "-p specified more than once";
              goto LAB_001064ba;
            }
            local_478 = pcVar19;
            if (uVar16 - sVar11 == -1) {
              free(__ptr);
              pcVar19 = "Missing argument for -p";
              goto LAB_001064ba;
            }
            goto LAB_00105da8;
          case 0x72:
            plVar18 = (long *)0x0;
            local_48c = 1;
            break;
          case 0x73:
            plVar18 = &opt_num_skip;
switchD_00105e20_caseD_6c:
            *plVar18 = 0;
            if ((2 - sVar11) + uVar16 == 1) {
              free(__ptr);
              pcVar19 = "Bad option: missing number";
              goto LAB_001064ba;
            }
            break;
          case 0x74:
            plVar18 = (long *)0x0;
            bVar6 = true;
            break;
          case 0x76:
            plVar18 = (long *)0x0;
            local_488 = 1;
          }
LAB_00105df7:
          pcVar19 = pcVar19 + 1;
        }
      }
      goto LAB_00105da8;
    }
    if (__ptr == (long *)0x0) {
      __ptr = (long *)mcpl_internal_calloc((long)argc,8);
    }
    __ptr[(int)uVar17] = (long)pcVar19;
    uVar17 = uVar17 + 1;
  }
LAB_00105da8:
  lVar21 = lVar21 + 1;
  goto LAB_00105bb8;
LAB_00105f51:
  if ((int)local_440 != 0) {
    mcpl_internal_fakeconstantversion_fakev = '\x01';
  }
  if ((!bVar7) && (local_478 != (char *)0x0)) {
    free(__ptr);
    pcVar19 = "-p can only be used with --extract.";
    goto LAB_001064ba;
  }
  if (bVar4 && !bVar3) {
    free(__ptr);
    pcVar19 = "--inplace can only be used with --merge.";
    goto LAB_001064ba;
  }
  if (local_484 != 0 && !bVar5) {
    free(__ptr);
    pcVar19 = "--keepuserflags can only be used with --forcemerge.";
    goto LAB_001064ba;
  }
  if (bVar5 && bVar3) {
    free(__ptr);
    pcVar19 = "--merge and --forcemerge can not both be specified .";
    goto LAB_001064ba;
  }
  iVar8 = (int)local_458;
  iVar9 = (iVar8 + iVar10 + 1) - (uint)(local_480 == (char *)0x0);
  if (!bVar7) {
    iVar9 = iVar9 + (uint)(opt_num_limit != -1) + (uint)(opt_num_skip != -1);
  }
  if (1 < (int)(((local_488 - (uint)!bVar6) + local_48c + (uint)(bVar3 || bVar5) +
                 (uint)(bVar7 || local_478 != (char *)0x0) + 2) - (uint)(iVar9 == 0))) {
    free(__ptr);
    pcVar19 = "Conflicting options specified.";
    goto LAB_001064ba;
  }
  if ((local_480 != (char *)0x0) && (1 < iVar9)) {
    free(__ptr);
    pcVar19 = "Do not specify other dump options with -b.";
    goto LAB_001064ba;
  }
  if (local_488 != 0) {
    free(__ptr);
    if (uVar17 == 0) {
      if (mcpl_internal_fakeconstantversion_fakev == '\x01') {
        pcVar19 = "MCPL version 99.99.99";
      }
      else {
        pcVar19 = "MCPL version 2.0.0";
      }
      puts(pcVar19);
      return 0;
    }
    pcVar19 = "Unrecognised arguments for --version.";
    goto LAB_001064ba;
  }
  if (bVar3 || bVar5) {
    if ((int)uVar17 < 2) {
      free(__ptr);
      pcVar19 = "Too few arguments for --merge.";
      if (bVar5) {
        pcVar19 = "Too few arguments for --forcemerge.";
      }
      goto LAB_001064ba;
    }
    if (!bVar5) {
      uVar16 = (ulong)!bVar4;
      do {
        uVar16 = uVar16 + 1;
        if (uVar17 <= uVar16) goto LAB_001062de;
        iVar10 = mcpl_can_merge((char *)__ptr[!bVar4],(char *)__ptr[uVar16]);
      } while (iVar10 != 0);
      free(__ptr);
      pcVar19 = "Requested files are incompatible for merge as they have different header info.";
      goto LAB_001064ba;
    }
LAB_001062de:
    if (bVar4) {
      if ((bVar5) || (!bVar3)) {
        mcpl_error("logic error in argument parsing");
      }
      for (uVar16 = 1; uVar16 < uVar17; uVar16 = uVar16 + 1) {
        mcpl_merge_inplace((char *)*__ptr,(char *)__ptr[uVar16]);
      }
      goto LAB_0010678a;
    }
    iVar10 = mcpl_file_certainly_exists((char *)*__ptr);
    if (iVar10 != 0) goto LAB_00106492;
    pcVar19 = (char *)*__ptr;
    sVar11 = strlen(pcVar19);
    if (sVar11 < 9) {
      bVar3 = true;
      if (3 < sVar11) goto LAB_0010659a;
    }
    else {
      iVar10 = strcmp(pcVar19 + (sVar11 - 8),".mcpl.gz");
      if (iVar10 == 0) {
        pcVar19 = mcpl_internal_malloc(sVar11 - 2);
        memcpy(pcVar19,(void *)*__ptr,sVar11 - 3);
        pcVar19[sVar11 - 3] = '\0';
        iVar10 = mcpl_file_certainly_exists(pcVar19);
        if (iVar10 != 0) {
          free(__ptr);
          pcVar19 = "Requested output file already exists (without .gz extension).";
          goto LAB_001064ba;
        }
        bVar3 = false;
      }
      else {
LAB_0010659a:
        iVar10 = strcmp(pcVar19 + (sVar11 - 3),".gz");
        bVar3 = true;
        if (iVar10 == 0) {
          free(__ptr);
          pcVar19 = "Requested output file should not have .gz extension (unless it is .mcpl.gz).";
          goto LAB_001064ba;
        }
      }
    }
    if (bVar5) {
      mVar13 = mcpl_forcemerge_files(pcVar19,uVar17 - 1,(char **)(__ptr + 1),local_484);
    }
    else {
      mVar13 = mcpl_merge_files(pcVar19,uVar17 - 1,(char **)(__ptr + 1));
    }
    if (bVar3) {
      mcpl_close_outfile(mVar13);
    }
    else {
      iVar10 = mcpl_closeandgzip_outfile(mVar13);
      if (iVar10 == 0) {
        printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",pcVar19);
      }
    }
    if (pcVar19 != (char *)*__ptr) {
      free(pcVar19);
    }
    goto LAB_0010678a;
  }
  if (bVar7) {
    if ((int)uVar17 < 3) {
      if (uVar17 != 2) {
        free(__ptr);
        pcVar19 = "Must specify both input and output files with --extract.";
        goto LAB_001064ba;
      }
      iVar10 = mcpl_file_certainly_exists((char *)__ptr[1]);
      if (iVar10 == 0) {
        mVar12 = mcpl_open_file((char *)*__ptr);
        mVar13 = mcpl_create_outfile((char *)__ptr[1]);
        mcpl_transfer_metadata(mVar12,mVar13);
        uVar2 = *(undefined8 *)((long)mVar12.internal + 0x40);
        if (local_448 == 0) {
          snprintf(comment,0x400,"mcpltool: extracted particles from file with %lu particles",uVar2)
          ;
          mcpl_hdr_add_comment(mVar13,comment);
        }
        if (local_478 == (char *)0x0) {
          uVar22._0_1_ = '\0';
          uVar22._1_1_ = '\0';
          uVar22._2_1_ = '\0';
          uVar22._3_1_ = '\0';
          uVar22._4_1_ = '\0';
          uVar22._5_1_ = '\0';
          uVar22._6_1_ = '\0';
          uVar22._7_1_ = '\0';
        }
        else {
          iVar10 = mcpl_str2int(local_478,0,(int64_t *)comment);
          if ((iVar10 == 0) ||
             (uVar22 = comment._0_8_,
             comment._0_8_ == 0 || (long)(int)comment._0_8_ != comment._0_8_)) {
            free(__ptr);
            pcVar19 = "Must specify non-zero 32bit integer as argument to -p.";
            goto LAB_001064ba;
          }
        }
        if (0 < opt_num_skip) {
          mcpl_seek(mVar12,opt_num_skip);
        }
        lVar21 = -1;
        if (0 < opt_num_limit) {
          lVar21 = opt_num_limit;
        }
        local_4a0 = 0;
        do {
          lVar20 = 1 - lVar21;
          do {
            lVar21 = lVar20;
            lVar20 = lVar21 + 1;
            if ((lVar20 == 2) || (pmVar14 = mcpl_read(mVar12), pmVar14 == (mcpl_particle_t *)0x0)) {
              pcVar19 = *mVar13.internal;
              sVar11 = strlen(pcVar19);
              __dest = mcpl_internal_malloc(sVar11 + 4);
              memcpy(__dest,pcVar19,sVar11 + 1);
              iVar10 = mcpl_closeandgzip_outfile(mVar13);
              if (iVar10 != 0) {
                builtin_strncpy(__dest + sVar11,".gz",4);
              }
              mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar12.internal);
              printf("MCPL: Successfully extracted %lu / %lu particles from %s into %s\n",local_4a0,
                     uVar2,*__ptr,__dest);
              free(__dest);
              free(__ptr);
              return 0;
            }
          } while (((int)uVar22 != 0) && ((int)uVar22 != pmVar14->pdgcode));
          mcpl_transfer_last_read_particle(mVar12,mVar13);
          local_4a0 = local_4a0 + 1;
          lVar21 = -lVar21;
        } while( true );
      }
LAB_00106492:
      free(__ptr);
      pcVar19 = "Requested output file already exists.";
      goto LAB_001064ba;
    }
  }
  else if (bVar6) {
    if ((int)uVar17 < 3) {
      if (uVar17 != 2) {
        free(__ptr);
        pcVar19 = "Must specify both input and output files with --text.";
        goto LAB_001064ba;
      }
      iVar10 = mcpl_file_certainly_exists((char *)__ptr[1]);
      if (iVar10 == 0) {
        mVar12 = mcpl_open_file((char *)*__ptr);
        __stream = (FILE *)mcpl_internal_fopen((char *)__ptr[1],"w");
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %lu\n#END-HEADER\n",
                  *(undefined8 *)((long)mVar12.internal + 0x40));
          fwrite("index     pdgcode               ekin[MeV]                   x[cm]                   y[cm]                   z[cm]                      ux                      uy                      uz                time[ms]                  weight                   pol-x                   pol-y                   pol-z  userflags\n"
                 ,0x13d,1,__stream);
          while (pmVar14 = mcpl_read(mVar12), pmVar14 != (mcpl_particle_t *)0x0) {
            fprintf(__stream,
                    "%5lu %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n"
                    ,pmVar14->ekin,pmVar14->position[0],pmVar14->position[1],pmVar14->position[2],
                    pmVar14->direction[0],pmVar14->direction[1],pmVar14->direction[2],pmVar14->time,
                    *(long *)((long)mVar12.internal + 0x88) + -1,(ulong)(uint)pmVar14->pdgcode,
                    (ulong)pmVar14->userflags,in_R9,pmVar14->weight,pmVar14->polarisation[0],
                    pmVar14->polarisation[1],pmVar14->polarisation[2]);
          }
          fclose(__stream);
          mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar12.internal);
          goto LAB_0010678a;
        }
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar12.internal);
        free(__ptr);
        pcVar19 = "Could not open output file.";
        goto LAB_001064ba;
      }
      goto LAB_00106492;
    }
  }
  else if ((int)uVar17 < 2) {
    if (uVar17 == 0) {
      free(__ptr);
      pcVar19 = "No input file specified";
      goto LAB_001064ba;
    }
    if (local_48c != 0) {
      mcpl_repair((char *)*__ptr);
      goto LAB_0010678a;
    }
    if (local_480 != (char *)0x0) {
      mVar12 = mcpl_open_file((char *)*__ptr);
      iVar10 = mcpl_hdr_blob(mVar12,local_480,&ldata,(char **)comment);
      if (iVar10 != 0) {
        mcpl_internal_dump_to_stdout((char *)comment._0_8_,(ulong)ldata);
        free(__ptr);
      }
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar12.internal);
      return (uint)(iVar10 == 0);
    }
    if (iVar10 == 0) {
      if (opt_num_limit < 0) goto LAB_00106814;
    }
    else {
      if ((opt_num_limit != -1) || (opt_num_skip != -1)) {
        free(__ptr);
        pcVar19 = "Do not specify -l or -s with --justhead";
        goto LAB_001064ba;
      }
LAB_00106814:
      opt_num_limit = 10;
    }
    if (opt_num_skip < 0) {
      opt_num_skip = 0;
    }
    if (iVar8 == 0 || iVar10 == 0) {
      uVar17 = 2;
      if (iVar8 == 0) {
        uVar17 = (uint)(iVar10 != 0);
      }
      mcpl_dump((char *)*__ptr,uVar17,opt_num_skip,opt_num_limit);
LAB_0010678a:
      free(__ptr);
      return 0;
    }
    free(__ptr);
    pcVar19 = "Do not supply both --justhead and --nohead.";
    goto LAB_001064ba;
  }
  free(__ptr);
  pcVar19 = "Too many arguments.";
LAB_001064ba:
  iVar10 = mcpl_tool_usage(argv,pcVar19);
  return iVar10;
}

Assistant:

int mcpl_tool(int argc,char** argv) {

  int nfilenames = 0;
  char ** filenames = NULL;
  const char * blobkey = NULL;
  const char * pdgcode_str = NULL;
  int opt_justhead = 0;
  int opt_nohead = 0;
  int64_t opt_num_limit = -1;
  int64_t opt_num_skip = -1;
  int opt_merge = 0;
  int opt_forcemerge = 0;
  int opt_keepuserflags = 0;
  int opt_inplace = 0;
  int opt_extract = 0;
  int opt_preventcomment = 0;//undocumented unoffical flag for mcpl unit tests
  int opt_repair = 0;
  int opt_version = 0;
  int opt_text = 0;
  int opt_fakeversion = 0;//undocumented unoffical flag for mcpl unit tests

  int i;
  for (i = 1; i<argc; ++i) {
    char * a = argv[i];
    size_t n=strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = NULL;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9') {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: expected number");
          }
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        if (a[j]=='b') {
          if (blobkey) {
            free(filenames);
            return mcpl_tool_usage(argv,"-b specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -b");
          }
          blobkey = a+j+1;
          break;
        }
        if (a[j]=='p') {
          if (pdgcode_str) {
            free(filenames);
            return mcpl_tool_usage(argv,"-p specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -p");
          }
          pdgcode_str = a+j+1;
          break;
        }

        switch(a[j]) {
        case 'h':
          {
            free(filenames);
            return mcpl_tool_usage(argv,0);
          }
        case 'j': opt_justhead = 1; break;
        case 'n': opt_nohead = 1; break;
        case 'm': opt_merge = 1; break;
        case 'e': opt_extract = 1; break;
        case 'r': opt_repair = 1; break;
        case 'v': opt_version = 1; break;
        case 't': opt_text = 1; break;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_skip; break;
        default:
          {
            free(filenames);
            return mcpl_tool_usage(argv,"Unrecognised option");
          }
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: missing number");
          }
        }
      }
    } else if (n>=3&&a[0]=='-'&&a[1]=='-') {
      a+=2;
      //long options:
      const char * lo_help = "help";
      const char * lo_justhead = "justhead";
      const char * lo_nohead = "nohead";
      const char * lo_merge = "merge";
      const char * lo_inplace = "inplace";
      const char * lo_extract = "extract";
      const char * lo_preventcomment = "preventcomment";
      const char * lo_fakeversion = "fakeversion";
      const char * lo_repair = "repair";
      const char * lo_version = "version";
      const char * lo_text = "text";
      const char * lo_forcemerge = "forcemerge";
      const char * lo_keepuserflags = "keepuserflags";
      //Use strstr instead of "strcmp(a,"--help")==0" to support shortened
      //versions (works since all our long-opts start with unique char).
      if (strstr(lo_help,a)==lo_help) return free(filenames), mcpl_tool_usage(argv,0);
      else if (strstr(lo_justhead,a)==lo_justhead) opt_justhead = 1;
      else if (strstr(lo_nohead,a)==lo_nohead) opt_nohead = 1;
      else if (strstr(lo_merge,a)==lo_merge) opt_merge = 1;
      else if (strstr(lo_forcemerge,a)==lo_forcemerge) opt_forcemerge = 1;
      else if (strstr(lo_keepuserflags,a)==lo_keepuserflags) opt_keepuserflags = 1;
      else if (strstr(lo_inplace,a)==lo_inplace) opt_inplace = 1;
      else if (strstr(lo_extract,a)==lo_extract) opt_extract = 1;
      else if (strstr(lo_repair,a)==lo_repair) opt_repair = 1;
      else if (strstr(lo_version,a)==lo_version) opt_version = 1;
      else if (strstr(lo_preventcomment,a)==lo_preventcomment) opt_preventcomment = 1;
      else if (strstr(lo_fakeversion,a)==lo_fakeversion) opt_fakeversion = 1;
      else if (strstr(lo_text,a)==lo_text) opt_text = 1;
      else return free(filenames),mcpl_tool_usage(argv,"Unrecognised option");
    } else if (n>=1&&a[0]!='-') {
      //input file
      if (!filenames)
        filenames = (char **)mcpl_internal_calloc(argc,sizeof(char*));
      filenames[nfilenames] = a;
      ++nfilenames;
    } else {
      return free(filenames),mcpl_tool_usage(argv,"Bad arguments");
    }
  }

  if ( opt_fakeversion )
    mcpl_internal_fakeconstantversion(1);

  if ( opt_extract==0 && pdgcode_str )
    return free(filenames),mcpl_tool_usage(argv,"-p can only be used with --extract.");

  if ( opt_merge==0 && opt_inplace!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--inplace can only be used with --merge.");

  if ( opt_forcemerge==0 && opt_keepuserflags!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--keepuserflags can only be used with --forcemerge.");

  if ( opt_merge!=0 && opt_forcemerge!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--merge and --forcemerge can not both be specified .");

  int number_dumpopts = (opt_justhead + opt_nohead + (blobkey!=0));
  if (opt_extract==0)
    number_dumpopts += (opt_num_limit!=-1) + (opt_num_skip!=-1);
  int any_dumpopts = number_dumpopts != 0;
  int any_extractopts = (opt_extract!=0||pdgcode_str!=0);
  int any_mergeopts = (opt_merge!=0||opt_forcemerge!=0);
  int any_textopts = (opt_text!=0);
  if (any_dumpopts+any_mergeopts+any_extractopts+any_textopts+opt_repair+opt_version>1)
    return free(filenames),mcpl_tool_usage(argv,"Conflicting options specified.");

  if (blobkey&&(number_dumpopts>1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify other dump options with -b.");

  if (opt_version) {
    free(filenames);
    if (nfilenames)
      return mcpl_tool_usage(argv,"Unrecognised arguments for --version.");

    if ( mcpl_internal_fakeconstantversion(0) )
      printf("MCPL version " "99.99.99" "\n");
    else
      printf("MCPL version " MCPL_VERSION_STR "\n");
    return 0;
  }

  if (any_mergeopts) {

    if (nfilenames<2)
      return free(filenames),mcpl_tool_usage(argv,
                                             (opt_forcemerge?"Too few arguments for --forcemerge.":"Too few arguments for --merge.") );

    int ifirstinfile = (opt_inplace ? 0 : 1);
    if (!opt_forcemerge) {
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        if (!mcpl_can_merge(filenames[ifirstinfile],filenames[i]))
          return free(filenames),mcpl_tool_usage(argv,"Requested files are incompatible for merge as they have different header info.");
    }

    if (opt_inplace) {
      if ( ! ( !opt_forcemerge && opt_merge) )
        mcpl_error("logic error in argument parsing");
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        mcpl_merge_inplace(filenames[ifirstinfile],filenames[i]);
    } else {
      if (mcpl_file_certainly_exists(filenames[0]))
        return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

      //Disallow .gz endings unless it is .mcpl.gz, in which case we attempt to gzip automatically.
      char * outfn = filenames[0];
      size_t lfn = strlen(outfn);
      int attempt_gzip = 0;
      if( lfn > 8 && !strcmp(outfn + (lfn - 8), ".mcpl.gz")) {
        attempt_gzip = 1;
        outfn = mcpl_internal_malloc(lfn-2);//lfn+1-3
        memcpy(outfn,filenames[0],lfn-3);
        outfn[lfn-3] = '\0';
        if (mcpl_file_certainly_exists(outfn))
          return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists (without .gz extension).");
      } else if( lfn > 3 && !strcmp(outfn + (lfn - 3), ".gz")) {
        return free(filenames),mcpl_tool_usage(argv,"Requested output file should not have .gz extension (unless it is .mcpl.gz).");
      }

      mcpl_outfile_t mf = ( opt_forcemerge ?
                            mcpl_forcemerge_files( outfn, nfilenames-1, (const char**)filenames + 1, opt_keepuserflags) :
                            mcpl_merge_files( outfn, nfilenames-1, (const char**)filenames + 1) );
      if (attempt_gzip) {
        if (!mcpl_closeandgzip_outfile(mf))
          printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",outfn);
      } else {
        mcpl_close_outfile(mf);
      }
      if (outfn != filenames[0])
        free(outfn);
    }

    free(filenames);
    return 0;
  }

  if (opt_extract) {
    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --extract.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    mcpl_outfile_t fo = mcpl_create_outfile(filenames[1]);
    mcpl_transfer_metadata(fi, fo);
    uint64_t fi_nparticles = mcpl_hdr_nparticles(fi);

    if (!opt_preventcomment) {
      char comment[1024];
      snprintf(comment, sizeof(comment), "mcpltool: extracted particles from"
               " file with %" PRIu64 " particles",fi_nparticles);
      mcpl_hdr_add_comment(fo,comment);
    }

    int32_t pdgcode_select = 0;
    if (pdgcode_str) {
      int64_t pdgcode64;
      if (!mcpl_str2int(pdgcode_str, 0, &pdgcode64) || -pdgcode64>2147483648 || pdgcode64>2147483647 || !pdgcode64)
        return free(filenames),mcpl_tool_usage(argv,"Must specify non-zero 32bit integer as argument to -p.");
      pdgcode_select = (int32_t)pdgcode64;
    }

    if (opt_num_skip>0)
      mcpl_seek(fi,(uint64_t)opt_num_skip);

    //uint64_t(-1) instead of UINT64_MAX to fix clang c++98 compilation
    uint64_t left = opt_num_limit>0 ? (uint64_t)opt_num_limit : (uint64_t)-1;
    uint64_t added = 0;

    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    for (;left;) {
      --left;
      const mcpl_particle_t* particle = mcpl_read(fi);
      if (!particle)
        break;
      if (pdgcode_select && pdgcode_select!= particle->pdgcode)
        continue;
      mcpl_transfer_last_read_particle(fi, fo);//Doing mcpl_add_particle(fo,particle) is potentially (very rarely) lossy
      ++added;
    }

    const char * outfile_fn = mcpl_outfile_filename(fo);
    size_t nn = strlen(outfile_fn);
    char *fo_filename = mcpl_internal_malloc(nn+4);
    //fo_filename[0] = '\0';
    memcpy(fo_filename,outfile_fn,nn+1);
    //memcpy(fo_filename+nn,".gz",4);
    //  strncat(fo_filename,mcpl_outfile_filename(fo),nn);
    if (mcpl_closeandgzip_outfile(fo))
      memcpy(fo_filename+nn,".gz",4);
    //strncat(fo_filename,".gz",3);
    mcpl_close_file(fi);

    printf("MCPL: Successfully extracted %" PRIu64 " / %" PRIu64 " particles from %s into %s\n",
           added,fi_nparticles,filenames[0],fo_filename);
    free(fo_filename);
    free(filenames);
    return 0;
  }

  if (opt_text) {

    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --text.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    FILE * fout = mcpl_internal_fopen(filenames[1],"w");
    if (!fout) {
      mcpl_close_file(fi);
      free(filenames);
      return mcpl_tool_usage(argv,"Could not open output file.");
    }

    fprintf(fout,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %" PRIu64 "\n#END-HEADER\n",mcpl_hdr_nparticles(fi));
    fprintf(fout,"index     pdgcode               ekin[MeV]                   x[cm]          "
            "         y[cm]                   z[cm]                      ux                  "
            "    uy                      uz                time[ms]                  weight  "
            "                 pol-x                   pol-y                   pol-z  userflags\n");
    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    while (1) {
      const mcpl_particle_t* p = mcpl_read(fi);
      if (!p)
        break;
      uint64_t idx = mcpl_currentposition(fi)-1;//-1 since mcpl_read skipped ahead
      fprintf( fout,"%5" PRIu64
               " %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g"
               " %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n",
               idx,p->pdgcode,p->ekin,p->position[0],p->position[1],p->position[2],
               p->direction[0],p->direction[1],p->direction[2],p->time,p->weight,
               p->polarisation[0],p->polarisation[1],p->polarisation[2],p->userflags);
    }
    fclose(fout);
    mcpl_close_file(fi);
    free(filenames);
    return 0;
  }

  if (nfilenames>1)
    return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

  if (!nfilenames)
    return free(filenames),mcpl_tool_usage(argv,"No input file specified");

  if (opt_repair) {
    mcpl_repair(filenames[0]);
    free(filenames);
    return 0;
  }

  //Dump mode:
  if (blobkey) {
    mcpl_file_t mcplfile = mcpl_open_file(filenames[0]);
    uint32_t ldata;
    const char * data;
    if (!mcpl_hdr_blob(mcplfile, blobkey, &ldata, &data)) {
      mcpl_close_file(mcplfile);
      return 1;
    }
    mcpl_internal_dump_to_stdout( data, ldata );
    free(filenames);
    mcpl_close_file(mcplfile);
    return 0;
  }

  if (opt_justhead&&(opt_num_limit!=-1||opt_num_skip!=-1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify -l or -s with --justhead");

  if (opt_num_limit<0) opt_num_limit = MCPLIMP_TOOL_DEFAULT_NLIMIT;
  if (opt_num_skip<0) opt_num_skip = MCPLIMP_TOOL_DEFAULT_NSKIP;

  if (opt_justhead&&opt_nohead)
    return free(filenames),mcpl_tool_usage(argv,"Do not supply both --justhead and --nohead.");

  int parts = 0;
  if (opt_nohead) parts=2;
  else if (opt_justhead) parts=1;
  mcpl_dump(filenames[0],parts,opt_num_skip,opt_num_limit);
  free(filenames);
  return 0;
}